

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PartialUnion.cpp
# Opt level: O3

void __thiscall dgrminer::PartialUnion::performSimpleTimeAbstraction(PartialUnion *this)

{
  pointer paVar1;
  pointer paVar2;
  int *piVar3;
  int iVar4;
  long lVar5;
  
  paVar1 = (this->nodes).
           super__Vector_base<std::array<int,_6UL>,_std::allocator<std::array<int,_6UL>_>_>._M_impl.
           super__Vector_impl_data._M_start;
  lVar5 = (long)(this->nodes).
                super__Vector_base<std::array<int,_6UL>,_std::allocator<std::array<int,_6UL>_>_>.
                _M_impl.super__Vector_impl_data._M_finish - (long)paVar1;
  if (lVar5 != 0) {
    lVar5 = (lVar5 >> 3) * -0x5555555555555555;
    lVar5 = lVar5 + (ulong)(lVar5 == 0);
    piVar3 = paVar1->_M_elems + 5;
    do {
      if (piVar3[-1] < 0) {
        iVar4 = -1;
LAB_00129ff1:
        piVar3[-1] = iVar4;
      }
      else {
        iVar4 = 1;
        if (piVar3[-1] != 0) goto LAB_00129ff1;
      }
      *piVar3 = -(uint)(*piVar3 != ((array<int,_6UL> *)(piVar3 + -5))->_M_elems[0]);
      piVar3 = piVar3 + 6;
      lVar5 = lVar5 + -1;
    } while (lVar5 != 0);
  }
  paVar2 = (this->edges).
           super__Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>._M_impl.
           super__Vector_impl_data._M_start;
  lVar5 = (long)(this->edges).
                super__Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>.
                _M_impl.super__Vector_impl_data._M_finish - (long)paVar2;
  if (lVar5 != 0) {
    lVar5 = lVar5 >> 5;
    lVar5 = lVar5 + (ulong)(lVar5 == 0);
    piVar3 = paVar2->_M_elems + 6;
    do {
      if (*piVar3 < 0) {
        iVar4 = -1;
LAB_0012a03c:
        *piVar3 = iVar4;
      }
      else {
        iVar4 = 1;
        if (*piVar3 != 0) goto LAB_0012a03c;
      }
      piVar3 = piVar3 + 8;
      lVar5 = lVar5 + -1;
    } while (lVar5 != 0);
  }
  return;
}

Assistant:

void PartialUnion::performSimpleTimeAbstraction()
	{
		for (size_t i = 0; i < nodes.size(); i++)
		{
			if (nodes[i][PN_CHANGETIME] < 0)
			{
				nodes[i][PN_CHANGETIME] = -1;
			}
			else if (nodes[i][PN_CHANGETIME] > 0)
			{
				nodes[i][PN_CHANGETIME] = 1;
			}
			nodes[i][PN_CHANGETIMELINK] = (nodes[i][PN_CHANGETIMELINK] == nodes[i][PN_TIME]) ? 0 : -1;
		}

		for (size_t i = 0; i < edges.size(); i++)
		{
			if (edges[i][PE_CHANGETIME] < 0)
			{
				edges[i][PE_CHANGETIME] = -1;
			}
			else if (edges[i][PE_CHANGETIME] > 0)
			{
				edges[i][PE_CHANGETIME] = 1;
			}
		}

	}